

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O1

exr_result_t exr_attr_chlist_destroy(exr_context_t ctxt,exr_attr_chlist_t *clist)

{
  exr_attr_chlist_entry_t *peVar1;
  exr_result_t eVar2;
  long lVar3;
  exr_attr_chlist_entry_t *s;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    eVar2 = 0;
    if (clist != (exr_attr_chlist_t *)0x0) {
      lVar3 = (long)clist->num_channels;
      peVar1 = clist->entries;
      s = peVar1;
      if (0 < lVar3) {
        do {
          exr_attr_string_destroy(ctxt,&s->name);
          lVar3 = lVar3 + -1;
          s = s + 1;
        } while (lVar3 != 0);
      }
      if (peVar1 != (exr_attr_chlist_entry_t *)0x0) {
        (*ctxt->free_fn)(peVar1);
      }
      clist->num_channels = 0;
      clist->num_alloced = 0;
      clist->entries = (exr_attr_chlist_entry_t *)0x0;
      eVar2 = 0;
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_chlist_destroy (exr_context_t ctxt, exr_attr_chlist_t* clist)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (clist)
    {
        exr_attr_chlist_t        nil = {0};
        int                      nc  = clist->num_channels;
        exr_attr_chlist_entry_t* entries =
            EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);

        for (int i = 0; i < nc; ++i)
            exr_attr_string_destroy (ctxt, &(entries[i].name));
        if (entries) ctxt->free_fn (entries);
        *clist = nil;
    }
    return EXR_ERR_SUCCESS;
}